

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O3

bool FIX::double_conversion::ConsumeSubString<char_const*>(char **current,char *end,char *substring)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = *current;
  if (*pcVar3 != *substring) {
    __assert_fail("**current == *substring",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x1a9,
                  "bool FIX::double_conversion::ConsumeSubString(Iterator *, Iterator, const char *) [Iterator = const char *]"
                 );
  }
  pcVar4 = substring + 1;
  do {
    pcVar3 = pcVar3 + 1;
    cVar1 = *pcVar4;
    *current = pcVar3;
    if ((cVar1 == '\0') || (pcVar3 == end)) break;
    cVar2 = *pcVar4;
    pcVar4 = pcVar4 + 1;
  } while (*pcVar3 == cVar2);
  return cVar1 == '\0';
}

Assistant:

static bool ConsumeSubString(Iterator* current,
                             Iterator end,
                             const char* substring) {
  ASSERT(**current == *substring);
  for (substring++; *substring != '\0'; substring++) {
    ++*current;
    if (*current == end || **current != *substring) return false;
  }
  ++*current;
  return true;
}